

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

bool __thiscall
QLocalSocket::setSocketDescriptor
          (QLocalSocket *this,qintptr socketDescriptor,LocalSocketState socketState,
          OpenMode openMode)

{
  long lVar1;
  bool bVar2;
  QLocalSocketPrivate *pQVar3;
  ulong socketDescriptor_00;
  LocalSocketState in_EDX;
  QFlags_conflict *in_RDI;
  long in_FS_OFFSET;
  SocketState unaff_retaddr;
  qintptr in_stack_00000008;
  QAbstractSocket *in_stack_00000010;
  SocketState newSocketState;
  QLocalSocketPrivate *d;
  OpenMode in_stack_0000007c;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QLocalSocket *)0x388757);
  uVar4 = 0;
  socketDescriptor_00 = (ulong)in_EDX;
  switch(socketDescriptor_00) {
  case 0:
    uVar4 = 0;
    break;
  case 2:
    uVar4 = 2;
    break;
  case 3:
    uVar4 = 3;
    break;
  case 6:
    uVar4 = 6;
  }
  QIODevice::open(in_RDI);
  pQVar3->state = in_EDX;
  QLocalSocketPrivate::describeSocket
            ((QLocalSocketPrivate *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),socketDescriptor_00);
  bVar2 = QAbstractSocket::setSocketDescriptor
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_0000007c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalSocket::setSocketDescriptor(qintptr socketDescriptor,
        LocalSocketState socketState, OpenMode openMode)
{
    Q_D(QLocalSocket);
    QAbstractSocket::SocketState newSocketState = QAbstractSocket::UnconnectedState;
    switch (socketState) {
    case ConnectingState:
        newSocketState = QAbstractSocket::ConnectingState;
        break;
    case ConnectedState:
        newSocketState = QAbstractSocket::ConnectedState;
        break;
    case ClosingState:
        newSocketState = QAbstractSocket::ClosingState;
        break;
    case UnconnectedState:
        newSocketState = QAbstractSocket::UnconnectedState;
        break;
    }
    QIODevice::open(openMode);
    d->state = socketState;
    d->describeSocket(socketDescriptor);
    return d->unixSocket.setSocketDescriptor(socketDescriptor,
                                             newSocketState, openMode);
}